

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CodedOutputStream::Refresh(CodedOutputStream *this)

{
  uint uVar1;
  bool bVar2;
  uint8 *local_20;
  void *void_buffer;
  CodedOutputStream *this_local;
  
  void_buffer = this;
  uVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                    (this->output_,&local_20,&this->buffer_size_);
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    this->buffer_ = local_20;
    this->total_bytes_ = this->buffer_size_ + this->total_bytes_;
  }
  else {
    this->buffer_ = (uint8 *)0x0;
    this->buffer_size_ = 0;
    this->had_error_ = true;
  }
  return bVar2;
}

Assistant:

bool CodedOutputStream::Refresh() {
  void* void_buffer;
  if (output_->Next(&void_buffer, &buffer_size_)) {
    buffer_ = reinterpret_cast<uint8*>(void_buffer);
    total_bytes_ += buffer_size_;
    return true;
  } else {
    buffer_ = NULL;
    buffer_size_ = 0;
    had_error_ = true;
    return false;
  }
}